

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContext.cpp
# Opt level: O0

void __thiscall
PDFHummus::DocumentContext::WriteReferenceState
          (DocumentContext *this,ObjectsContext *inStateWriter,ObjectReference *inReference)

{
  DictionaryContext *pDVar1;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  DictionaryContext *local_28;
  DictionaryContext *referenceContext;
  ObjectReference *inReference_local;
  ObjectsContext *inStateWriter_local;
  DocumentContext *this_local;
  
  referenceContext = (DictionaryContext *)inReference;
  inReference_local = (ObjectReference *)inStateWriter;
  inStateWriter_local = (ObjectsContext *)this;
  pDVar1 = ObjectsContext::StartDictionary(inStateWriter);
  local_28 = pDVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"ObjectID",&local_49);
  DictionaryContext::WriteKey(pDVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  DictionaryContext::WriteIntegerValue(local_28,(longlong)referenceContext->mObjectsContext);
  pDVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"GenerationNumber",&local_81);
  DictionaryContext::WriteKey(pDVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  DictionaryContext::WriteIntegerValue
            (local_28,*(longlong *)&(referenceContext->mKeys)._M_t._M_impl);
  ObjectsContext::EndDictionary((ObjectsContext *)inReference_local,local_28);
  return;
}

Assistant:

void DocumentContext::WriteReferenceState(ObjectsContext* inStateWriter,
                                          const ObjectReference& inReference)
{
    DictionaryContext* referenceContext = inStateWriter->StartDictionary();

    referenceContext->WriteKey("ObjectID");
    referenceContext->WriteIntegerValue(inReference.ObjectID);

    referenceContext->WriteKey("GenerationNumber");
    referenceContext->WriteIntegerValue(inReference.GenerationNumber);

    inStateWriter->EndDictionary(referenceContext);
}